

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biquad_filter.c
# Opt level: O2

int mixed_make_segment_biquad_filter
              (mixed_biquad_filter type,float frequency,uint32_t samplerate,mixed_segment *segment)

{
  int iVar1;
  biquad_filter_segment_data *data;
  
  if ((float)samplerate <= frequency) {
    iVar1 = 8;
  }
  else {
    data = (biquad_filter_segment_data *)(*mixed_calloc)(1,0x70);
    if (data != (biquad_filter_segment_data *)0x0) {
      data->samplerate = samplerate;
      data->frequency = frequency;
      data->Q = 1.0;
      data->gain = 1.0;
      data->type = type;
      iVar1 = biquad_reinit(data);
      if (iVar1 == 0) {
        (*mixed_free)(data);
        return 0;
      }
      segment->free = biquad_filter_segment_free;
      segment->start = biquad_filter_segment_start;
      segment->mix = biquad_segment_mix;
      segment->set_in = biquad_filter_segment_set_in;
      segment->set_out = biquad_filter_segment_set_out;
      segment->info = biquad_filter_segment_info;
      segment->get = biquad_filter_segment_get;
      segment->set = biquad_filter_segment_set;
      segment->data = data;
      return 1;
    }
    iVar1 = 1;
  }
  mixed_err(iVar1);
  return 0;
}

Assistant:

MIXED_EXPORT int mixed_make_segment_biquad_filter(enum mixed_biquad_filter type, float frequency, uint32_t samplerate, struct mixed_segment *segment){
  if(samplerate <= frequency){
    mixed_err(MIXED_INVALID_VALUE);
    return 0;
  }
  
  struct biquad_filter_segment_data *data = mixed_calloc(1, sizeof(struct biquad_filter_segment_data));
  if(!data){
    mixed_err(MIXED_OUT_OF_MEMORY);
    return 0;
  }

  data->samplerate = samplerate;
  data->frequency = frequency;
  data->Q = 1.0;
  data->gain = 1.0;
  data->type = type;

  if(!biquad_reinit(data)){
    mixed_free(data);
    return 0;
  }
  
  segment->free = biquad_filter_segment_free;
  segment->start = biquad_filter_segment_start;
  segment->mix = biquad_segment_mix;
  segment->set_in = biquad_filter_segment_set_in;
  segment->set_out = biquad_filter_segment_set_out;
  segment->info = biquad_filter_segment_info;
  segment->get = biquad_filter_segment_get;
  segment->set = biquad_filter_segment_set;
  segment->data = data;
  return 1;
}